

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpString(TString *s,DumpState *D)

{
  int iVar1;
  void *pvVar2;
  TString *pTVar3;
  lua_State *plVar4;
  size_t sVar5;
  lu_byte x_2;
  lu_byte x;
  lu_byte x_1;
  size_t size;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  ulong local_20;
  
  if (s == (TString *)0x0) {
    local_23 = 0;
    if (D->status != 0) {
      return;
    }
    plVar4 = D->L;
    pvVar2 = D->data;
    pTVar3 = (TString *)&local_23;
    sVar5 = 1;
  }
  else {
    if (s->tt == '\x04') {
      sVar5 = (size_t)s->shrlen;
    }
    else {
      sVar5 = (s->u).lnglen;
    }
    local_20 = sVar5 + 1;
    if (local_20 < 0xff) {
      local_22 = (undefined1)local_20;
      iVar1 = D->status;
      if (iVar1 == 0) {
        iVar1 = (*D->writer)(D->L,&local_22,1,D->data);
        D->status = iVar1;
      }
    }
    else {
      local_21 = 0xff;
      if (D->status != 0) {
        return;
      }
      iVar1 = (*D->writer)(D->L,&local_21,1,D->data);
      D->status = iVar1;
      if (iVar1 != 0) {
        return;
      }
      iVar1 = (*D->writer)(D->L,&local_20,8,D->data);
      D->status = iVar1;
      sVar5 = local_20 - 1;
    }
    if (sVar5 == 0) {
      return;
    }
    if (iVar1 != 0) {
      return;
    }
    pTVar3 = s + 1;
    plVar4 = D->L;
    pvVar2 = D->data;
  }
  iVar1 = (*D->writer)(plVar4,pTVar3,sVar5,pvVar2);
  D->status = iVar1;
  return;
}

Assistant:

static void DumpString (const TString *s, DumpState *D) {
  if (s == NULL)
    DumpByte(0, D);
  else {
    size_t size = tsslen(s) + 1;  /* include trailing '\0' */
    const char *str = getstr(s);
    if (size < 0xFF)
      DumpByte(cast_int(size), D);
    else {
      DumpByte(0xFF, D);
      DumpVar(size, D);
    }
    DumpVector(str, size - 1, D);  /* no need to save '\0' */
  }
}